

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O2

void __thiscall
HighsDomain::setDomainChangeStack
          (HighsDomain *this,
          vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *domchgstack,
          vector<int,_std::allocator<int>_> *branchingPositions)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  pointer pHVar5;
  pointer pHVar6;
  pointer piVar7;
  pointer ppVar8;
  pointer pRVar9;
  int *piVar10;
  bool bVar11;
  byte bVar12;
  ulong uVar13;
  int *piVar14;
  pointer piVar15;
  iterator __begin2;
  pointer pHVar16;
  pointer piVar17;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  HighsDomainChange boundchg;
  HighsDomainChange boundchg_00;
  HighsDomainChange boundchg_01;
  int local_48;
  
  this->infeasible_ = false;
  pHVar5 = (this->domchgstack_).
           super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
           super__Vector_impl_data._M_start;
  pHVar6 = (this->domchgstack_).
           super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pHVar5 != pHVar6) {
    piVar15 = (this->colLowerPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    piVar7 = (this->colUpperPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (pHVar16 = pHVar5; pHVar16 != pHVar6; pHVar16 = pHVar16 + 1) {
      piVar17 = piVar7;
      if (pHVar16->boundtype == kLower) {
        piVar17 = piVar15;
      }
      piVar17[pHVar16->column] = -1;
    }
  }
  ppVar8 = (this->prevboundval_).
           super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->prevboundval_).
      super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>._M_impl.
      super__Vector_impl_data._M_finish != ppVar8) {
    (this->prevboundval_).
    super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>._M_impl.
    super__Vector_impl_data._M_finish = ppVar8;
  }
  if (pHVar5 != pHVar6) {
    (this->domchgstack_).super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>.
    _M_impl.super__Vector_impl_data._M_finish = pHVar5;
  }
  pRVar9 = (this->domchgreason_).
           super__Vector_base<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->domchgreason_).
      super__Vector_base<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_>._M_impl.
      super__Vector_impl_data._M_finish != pRVar9) {
    (this->domchgreason_).
    super__Vector_base<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_>._M_impl.
    super__Vector_impl_data._M_finish = pRVar9;
  }
  piVar15 = (this->branchPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->branchPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar15) {
    (this->branchPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
    ._M_finish = piVar15;
  }
  uVar13 = (ulong)((long)(domchgstack->
                         super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>).
                         _M_impl.super__Vector_impl_data._M_finish -
                  (long)(domchgstack->
                        super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>).
                        _M_impl.super__Vector_impl_data._M_start) >> 4;
  piVar14 = (branchingPositions->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  piVar10 = (branchingPositions->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  uVar19 = 0;
  while( true ) {
    iVar18 = (int)uVar19;
    local_48 = (int)uVar13;
    if (piVar14 == piVar10) break;
    iVar4 = *piVar14;
    uVar19 = (ulong)iVar18;
    lVar21 = uVar19 << 0x20;
    uVar20 = uVar19 << 4 | 0xc;
    for (; (long)uVar19 < (long)iVar4; uVar19 = uVar19 + 1) {
      pHVar5 = (domchgstack->
               super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>)._M_impl.
               super__Vector_impl_data._M_start;
      iVar18 = *(int *)((long)&pHVar5->boundval + uVar20);
      dVar2 = *(double *)((long)pHVar5 + (uVar20 - 0xc));
      if (iVar18 == 1) {
        if (dVar2 < (this->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[*(int *)((long)pHVar5 + (uVar20 - 4))])
        goto LAB_002a3b7c;
      }
      else if ((iVar18 != 0) ||
              ((this->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[*(int *)((long)pHVar5 + (uVar20 - 4))] < dVar2)) {
LAB_002a3b7c:
        boundchg._8_8_ = *(undefined8 *)((long)pHVar5 + (uVar20 - 4));
        boundchg.boundval = dVar2;
        changeBound(this,boundchg,(Reason)0xfffffffe);
        bVar12 = this->infeasible_;
        if ((bool)bVar12 == false) {
          propagate(this);
          bVar12 = this->infeasible_;
        }
        if ((bVar12 & 1) != 0) {
          return;
        }
      }
      lVar21 = lVar21 + 0x100000000;
      uVar20 = uVar20 + 0x10;
    }
    uVar20 = uVar13;
    if (local_48 == (int)uVar19) {
LAB_002a3c6d:
      iVar18 = (int)uVar20;
      if (piVar14 != piVar10) {
        return;
      }
      break;
    }
    pHVar5 = (domchgstack->super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
             )._M_impl.super__Vector_impl_data._M_start;
    lVar21 = lVar21 >> 0x1c;
    dVar2 = *(double *)((long)&pHVar5->boundval + lVar21);
    iVar18 = *(int *)((long)&pHVar5->column + lVar21);
    if (*(int *)((long)&pHVar5->boundtype + lVar21) == 0) {
      dVar3 = (this->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[iVar18];
      if (dVar2 <= dVar3) {
        if (dVar3 <= dVar2) {
          piVar15 = (this->colLowerPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          goto LAB_002a3c21;
        }
        goto LAB_002a3c55;
      }
LAB_002a3c27:
      boundchg_00._8_8_ = *(undefined8 *)((long)&pHVar5->column + lVar21);
      boundchg_00.boundval = dVar2;
      changeBound(this,boundchg_00,(Reason)0xffffffff);
      uVar20 = uVar19;
      if ((this->infeasible_ == true) || (propagate(this), (this->infeasible_ & 1U) != 0))
      goto LAB_002a3c6d;
    }
    else {
      pdVar1 = (this->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + iVar18;
      bVar11 = dVar2 < *pdVar1;
      if (bVar11) goto LAB_002a3c27;
      if (bVar11 || dVar2 == *pdVar1) {
        piVar15 = (this->colUpperPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
LAB_002a3c21:
        if (piVar15[iVar18] == -1) goto LAB_002a3c27;
      }
    }
LAB_002a3c55:
    piVar14 = piVar14 + 1;
  }
  lVar21 = (long)iVar18;
  uVar13 = lVar21 << 4 | 0xc;
  do {
    if (local_48 <= lVar21) {
      return;
    }
    pHVar5 = (domchgstack->super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
             )._M_impl.super__Vector_impl_data._M_start;
    iVar18 = *(int *)((long)&pHVar5->boundval + uVar13);
    dVar2 = *(double *)((long)pHVar5 + (uVar13 - 0xc));
    if (iVar18 == 1) {
      if (dVar2 < (this->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[*(int *)((long)pHVar5 + (uVar13 - 4))])
      goto LAB_002a3ce3;
    }
    else if ((iVar18 != 0) ||
            ((this->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[*(int *)((long)pHVar5 + (uVar13 - 4))] < dVar2)) {
LAB_002a3ce3:
      boundchg_01._8_8_ = *(undefined8 *)((long)pHVar5 + (uVar13 - 4));
      boundchg_01.boundval = dVar2;
      changeBound(this,boundchg_01,(Reason)0xfffffffe);
      if (this->infeasible_ != false) {
        return;
      }
      propagate(this);
      if ((this->infeasible_ & 1U) != 0) {
        return;
      }
    }
    lVar21 = lVar21 + 1;
    uVar13 = uVar13 + 0x10;
  } while( true );
}

Assistant:

void HighsDomain::setDomainChangeStack(
    const std::vector<HighsDomainChange>& domchgstack,
    const std::vector<HighsInt>& branchingPositions) {
  infeasible_ = false;
  mipsolver->mipdata_->debugSolution.resetDomain(*this);

  if (!domchgstack_.empty()) {
    for (const HighsDomainChange& domchg : domchgstack_) {
      if (domchg.boundtype == HighsBoundType::kLower)
        colLowerPos_[domchg.column] = -1;
      else
        colUpperPos_[domchg.column] = -1;
    }
  }

  prevboundval_.clear();
  domchgstack_.clear();
  domchgreason_.clear();
  branchPos_.clear();
  HighsInt stacksize = domchgstack.size();
  HighsInt k = 0;
  for (HighsInt branchPos : branchingPositions) {
    for (; k < branchPos; ++k) {
      if (domchgstack[k].boundtype == HighsBoundType::kLower &&
          domchgstack[k].boundval <= col_lower_[domchgstack[k].column])
        continue;
      if (domchgstack[k].boundtype == HighsBoundType::kUpper &&
          domchgstack[k].boundval >= col_upper_[domchgstack[k].column])
        continue;

      changeBound(domchgstack[k], Reason::unspecified());
      if (!infeasible_) propagate();
      if (infeasible_) return;
    }

    if (k == stacksize) return;

    // For redundant branching bound changes we need to be more careful due to
    // symmetry handling. If these bound changes are redundant simply because
    // the corresponding subtree was enumerated and hence the global bound
    // updated, then we still need to keep their status as branching variables
    // for computing correct stabilizers. They can, however, be safely dropped
    // if they are either strictly redundant in the global domain, or if there
    // is already a local bound change that makes the branching change
    // redundant.
    if (domchgstack[k].boundtype == HighsBoundType::kLower) {
      if (domchgstack[k].boundval <= col_lower_[domchgstack[k].column]) {
        if (domchgstack[k].boundval < col_lower_[domchgstack[k].column])
          continue;
        if (colLowerPos_[domchgstack[k].column] != -1) continue;
      }
    } else {
      if (domchgstack[k].boundval >= col_upper_[domchgstack[k].column]) {
        if (domchgstack[k].boundval > col_upper_[domchgstack[k].column])
          continue;
        if (colUpperPos_[domchgstack[k].column] != -1) continue;
      }
    }

    changeBound(domchgstack[k], Reason::branching());
    if (!infeasible_) propagate();
    if (infeasible_) return;
  }

  for (; k < stacksize; ++k) {
    if (domchgstack[k].boundtype == HighsBoundType::kLower &&
        domchgstack[k].boundval <= col_lower_[domchgstack[k].column])
      continue;
    if (domchgstack[k].boundtype == HighsBoundType::kUpper &&
        domchgstack[k].boundval >= col_upper_[domchgstack[k].column])
      continue;

    mipsolver->mipdata_->debugSolution.boundChangeAdded(*this, domchgstack[k],
                                                        true);

    changeBound(domchgstack[k], Reason::unspecified());
    if (!infeasible_) propagate();
    if (infeasible_) break;
  }
}